

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_zip.cpp
# Opt level: O1

void duckdb::ListZipFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  LogicalTypeId LVar2;
  pointer pVVar3;
  idx_t count;
  pointer pVVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  byte bVar10;
  undefined8 uVar11;
  element_type *peVar12;
  data_t dVar13;
  bool bVar14;
  Vector *pVVar15;
  reference pvVar16;
  reference pvVar17;
  idx_t iVar18;
  pointer pSVar19;
  reference pvVar20;
  reference pvVar21;
  TemplatedValidityData<unsigned_long> *pTVar22;
  reference pvVar23;
  reference pvVar24;
  pointer pVVar25;
  type vector;
  idx_t idx_in_entry;
  size_type sVar26;
  ulong uVar27;
  size_type sVar28;
  size_type __n;
  ulong uVar29;
  idx_t idx_in_entry_1;
  ulong uVar30;
  long lVar31;
  idx_t iVar32;
  ulong uVar33;
  ulong __n_00;
  vector<duckdb::SelectionVector,_true> selections;
  vector<unsigned_long,_true> lengths;
  vector<duckdb::ValidityMask,_true> masks;
  vector<duckdb::UnifiedVectorFormat,_true> input_lists;
  idx_t local_110;
  ulong local_108;
  LogicalType local_e8;
  idx_t local_d0;
  vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_> local_c8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_a8;
  idx_t local_a0;
  vector<unsigned_long,_true> local_98;
  Vector *local_80;
  vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_> local_78;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_58;
  data_ptr_t local_40;
  ulong local_38;
  
  pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  count = args->count;
  pVVar4 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = result->data;
  local_80 = result;
  pVVar15 = ListVector::GetEntry(result);
  local_a8 = StructVector::GetEntries(pVVar15);
  pvVar16 = vector<duckdb::Vector,_true>::back(&args->data);
  LVar2 = (pvVar16->type).id_;
  local_58.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::resize
            (&local_58,
             ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar26 = 0;
    do {
      pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar26);
      pvVar17 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                          ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_58,sVar26);
      Vector::ToUnifiedFormat(pvVar16,count,pvVar17);
      sVar26 = sVar26 + 1;
    } while (sVar26 < (ulong)(((long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  sVar26 = ((long)pVVar3 - (long)pVVar4 >> 3) * 0x4ec4ec4ec4ec4ec5 - (ulong)(LVar2 == BOOLEAN);
  local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (unsigned_long *)0x0;
  local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (unsigned_long *)0x0;
  if (count == 0) {
    local_110 = 0;
  }
  else {
    local_110 = 0;
    iVar32 = 0;
    do {
      if (LVar2 == BOOLEAN) {
        pvVar17 = vector<duckdb::UnifiedVectorFormat,_true>::back
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_58);
        psVar5 = pvVar17->sel->sel_vector;
        iVar18 = iVar32;
        if (psVar5 != (sel_t *)0x0) {
          iVar18 = (idx_t)psVar5[iVar32];
        }
        puVar6 = (pvVar17->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar6 != (unsigned_long *)0x0) && ((puVar6[iVar18 >> 6] >> (iVar18 & 0x3f) & 1) == 0))
        goto LAB_014127bf;
        dVar13 = pvVar17->data[iVar18];
      }
      else {
LAB_014127bf:
        dVar13 = '\0';
      }
      local_c8.super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (dVar13 != '\0') {
        local_c8.
        super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x7fffffff;
      }
      if (sVar26 != 0) {
        sVar28 = 0;
        do {
          pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar28);
          LogicalType::LogicalType(&local_e8,SQLNULL);
          bVar14 = LogicalType::operator==(&pvVar16->type,&local_e8);
          if (bVar14) {
            LogicalType::~LogicalType(&local_e8);
LAB_014128b0:
            pSVar19 = (pointer)0x0;
          }
          else {
            pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar28);
            iVar18 = ListVector::GetListSize(pvVar16);
            LogicalType::~LogicalType(&local_e8);
            if (iVar18 == 0) goto LAB_014128b0;
            pvVar17 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_58,sVar28);
            psVar5 = pvVar17->sel->sel_vector;
            iVar18 = iVar32;
            if (psVar5 != (sel_t *)0x0) {
              iVar18 = (idx_t)psVar5[iVar32];
            }
            pvVar17 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_58,sVar28);
            pdVar7 = pvVar17->data;
            pvVar17 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_58,sVar28);
            puVar6 = (pvVar17->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar6 == (unsigned_long *)0x0) ||
               ((puVar6[iVar18 >> 6] >> (iVar18 & 0x3f) & 1) != 0)) {
              pSVar19 = *(pointer *)(pdVar7 + iVar18 * 0x10 + 8);
            }
            else {
              pSVar19 = (pointer)0x0;
            }
          }
          if (dVar13 == '\0') {
            if (pSVar19 < local_c8.
                          super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
              pSVar19 = local_c8.
                        super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          else if (local_c8.
                   super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                   ._M_impl.super__Vector_impl_data._M_start < pSVar19) {
            pSVar19 = local_c8.
                      super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          sVar28 = sVar28 + 1;
          local_c8.
          super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
          _M_impl.super__Vector_impl_data._M_start = pSVar19;
        } while (sVar26 != sVar28);
      }
      if (local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,
                   (iterator)
                   local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&local_c8);
      }
      else {
        *local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_long)
             local_c8.
             super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_110 = (long)&(local_c8.
                          super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>
                          ._M_impl.super__Vector_impl_data._M_start)->sel_vector + local_110;
      iVar32 = iVar32 + 1;
    } while (iVar32 != count);
  }
  pVVar15 = local_80;
  ListVector::SetListSize(local_80,local_110);
  ListVector::Reserve(pVVar15,local_110);
  local_c8.super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (sVar26 != 0) {
    sVar28 = sVar26;
    do {
      SelectionVector::SelectionVector((SelectionVector *)&local_e8,local_110);
      ::std::vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>::
      emplace_back<duckdb::SelectionVector>(&local_c8,(SelectionVector *)&local_e8);
      if (local_e8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      local_e8._0_8_ = (element_type *)0x0;
      local_e8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_e8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d0 = local_110;
      ::std::vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>::
      emplace_back<duckdb::ValidityMask>(&local_78,(ValidityMask *)&local_e8);
      if (local_e8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      sVar28 = sVar28 - 1;
    } while (sVar28 != 0);
  }
  if (count != 0) {
    __n_00 = 0;
    local_108 = 0;
    do {
      pvVar20 = vector<unsigned_long,_true>::operator[](&local_98,__n_00);
      uVar8 = *pvVar20;
      if (sVar26 != 0) {
        __n = 0;
        local_38 = __n_00;
        do {
          pvVar17 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                              ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_58,__n);
          psVar5 = pvVar17->sel->sel_vector;
          uVar33 = __n_00;
          if (psVar5 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar5[__n_00];
          }
          puVar6 = (pvVar17->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0)) {
            uVar30 = *(ulong *)(pvVar17->data + uVar33 * 0x10 + 8);
            uVar29 = uVar30;
            if (uVar8 < uVar30) {
              uVar29 = uVar8;
            }
            if (uVar29 != 0) {
              uVar33 = *(ulong *)(pvVar17->data + uVar33 * 0x10);
              uVar27 = local_108;
              do {
                pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
                pVVar15 = ListVector::GetEntry(pvVar16);
                FlatVector::VerifyFlatVector(pVVar15);
                puVar6 = (pVVar15->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask;
                if ((puVar6 != (unsigned_long *)0x0) &&
                   ((puVar6[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0)) {
                  pvVar21 = vector<duckdb::ValidityMask,_true>::operator[]
                                      ((vector<duckdb::ValidityMask,_true> *)&local_78,__n);
                  if ((pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_a0 = (pvVar21->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_e8,&local_a0);
                    peVar12 = local_e8.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                    uVar11 = local_e8._0_8_;
                    local_e8._0_8_ = (element_type *)0x0;
                    local_e8.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    p_Var9 = (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)uVar11;
                    (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12;
                    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                    }
                    if (local_e8.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        != (element_type *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_e8.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
                    }
                    pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(&(pvVar21->super_TemplatedValidityMask<unsigned_long>).
                                          validity_data);
                    (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar22->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                  }
                  bVar10 = (byte)uVar27 & 0x3f;
                  puVar1 = (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar27 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
                }
                pvVar23 = vector<duckdb::SelectionVector,_true>::operator[]
                                    ((vector<duckdb::SelectionVector,_true> *)&local_c8,__n);
                pvVar23->sel_vector[uVar27] = (sel_t)uVar33;
                uVar27 = uVar27 + 1;
                uVar33 = uVar33 + 1;
                uVar29 = uVar29 - 1;
                __n_00 = local_38;
              } while (uVar29 != 0);
            }
          }
          else {
            uVar30 = 0;
          }
          lVar31 = uVar8 - uVar30;
          if (uVar30 <= uVar8 && lVar31 != 0) {
            uVar30 = uVar30 + local_108;
            do {
              pvVar21 = vector<duckdb::ValidityMask,_true>::operator[]
                                  ((vector<duckdb::ValidityMask,_true> *)&local_78,__n);
              if ((pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                  (unsigned_long *)0x0) {
                local_a0 = (pvVar21->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_e8,&local_a0);
                peVar12 = local_e8.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
                uVar11 = local_e8._0_8_;
                local_e8._0_8_ = (element_type *)0x0;
                local_e8.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                p_Var9 = (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data.
                         internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)uVar11;
                (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12;
                if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                }
                if (local_e8.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_e8.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                }
                pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(pvVar21->super_TemplatedValidityMask<unsigned_long>).
                                      validity_data);
                (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     (unsigned_long *)
                     (pTVar22->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar10 = (byte)uVar30 & 0x3f;
              puVar1 = (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       (uVar30 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              pvVar23 = vector<duckdb::SelectionVector,_true>::operator[]
                                  ((vector<duckdb::SelectionVector,_true> *)&local_c8,__n);
              pvVar23->sel_vector[uVar30] = 0;
              uVar30 = uVar30 + 1;
              lVar31 = lVar31 + -1;
            } while (lVar31 != 0);
          }
          __n = __n + 1;
        } while (__n != sVar26);
      }
      *(ulong *)(local_40 + __n_00 * 0x10 + 8) = uVar8;
      *(ulong *)(local_40 + __n_00 * 0x10) = local_108;
      local_108 = local_108 + uVar8;
      __n_00 = __n_00 + 1;
    } while (__n_00 != count);
  }
  if (sVar26 != 0) {
    sVar28 = 0;
    do {
      pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar28);
      LogicalType::LogicalType(&local_e8,SQLNULL);
      bVar14 = LogicalType::operator==(&pvVar16->type,&local_e8);
      LogicalType::~LogicalType(&local_e8);
      if (!bVar14) {
        pvVar24 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_a8,sVar28);
        pVVar25 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar24);
        pvVar16 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar28);
        pVVar15 = ListVector::GetEntry(pvVar16);
        pvVar23 = vector<duckdb::SelectionVector,_true>::operator[]
                            ((vector<duckdb::SelectionVector,_true> *)&local_c8,sVar28);
        Vector::Slice(pVVar25,pVVar15,pvVar23,local_110);
      }
      pvVar24 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](local_a8,sVar28);
      pVVar25 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          (pvVar24);
      Vector::Flatten(pVVar25,local_110);
      pvVar24 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](local_a8,sVar28);
      vector = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar24);
      pvVar21 = vector<duckdb::ValidityMask,_true>::operator[]
                          ((vector<duckdb::ValidityMask,_true> *)&local_78,sVar28);
      FlatVector::VerifyFlatVector(vector);
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar21->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar21->super_TemplatedValidityMask<unsigned_long>).capacity;
      sVar28 = sVar28 + 1;
    } while (sVar26 != sVar28);
  }
  bVar14 = DataChunk::AllConstant(args);
  Vector::SetVectorType(local_80,bVar14 * '\x02');
  ::std::vector<duckdb::ValidityMask,_std::allocator<duckdb::ValidityMask>_>::~vector(&local_78);
  ::std::vector<duckdb::SelectionVector,_std::allocator<duckdb::SelectionVector>_>::~vector
            (&local_c8);
  if (local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            (&local_58);
  return;
}

Assistant:

static void ListZipFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	idx_t count = args.size();
	idx_t args_size = args.ColumnCount();
	auto *result_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_struct = ListVector::GetEntry(result);
	auto &struct_entries = StructVector::GetEntries(result_struct);
	bool truncate_flags_set = false;

	// Check flag
	if (args.data.back().GetType().id() == LogicalTypeId::BOOLEAN) {
		truncate_flags_set = true;
		args_size--;
	}

	vector<UnifiedVectorFormat> input_lists;
	input_lists.resize(args.ColumnCount());
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		args.data[i].ToUnifiedFormat(count, input_lists[i]);
	}

	// Handling output row for each input row
	idx_t result_size = 0;
	vector<idx_t> lengths;
	for (idx_t j = 0; j < count; j++) {
		// Is flag for current row set
		bool truncate_to_shortest = false;
		if (truncate_flags_set) {
			auto &flag_vec = input_lists.back();
			idx_t flag_idx = flag_vec.sel->get_index(j);
			if (flag_vec.validity.RowIsValid(flag_idx)) {
				truncate_to_shortest = UnifiedVectorFormat::GetData<bool>(flag_vec)[flag_idx];
			}
		}

		// Calculation of the outgoing list size
		idx_t len = truncate_to_shortest ? NumericLimits<int>::Maximum() : 0;
		for (idx_t i = 0; i < args_size; i++) {
			idx_t curr_size;
			if (args.data[i].GetType() == LogicalType::SQLNULL || ListVector::GetListSize(args.data[i]) == 0) {
				curr_size = 0;
			} else {
				idx_t sel_idx = input_lists[i].sel->get_index(j);
				auto curr_data = UnifiedVectorFormat::GetData<list_entry_t>(input_lists[i]);
				curr_size = input_lists[i].validity.RowIsValid(sel_idx) ? curr_data[sel_idx].length : 0;
			}

			// Dependent on flag using gt or lt
			if (truncate_to_shortest) {
				len = len > curr_size ? curr_size : len;
			} else {
				len = len < curr_size ? curr_size : len;
			}
		}
		lengths.push_back(len);
		result_size += len;
	}

	ListVector::SetListSize(result, result_size);
	ListVector::Reserve(result, result_size);
	vector<SelectionVector> selections;
	vector<ValidityMask> masks;
	for (idx_t i = 0; i < args_size; i++) {
		selections.push_back(SelectionVector(result_size));
		masks.push_back(ValidityMask(result_size));
	}

	idx_t offset = 0;
	for (idx_t j = 0; j < count; j++) {
		idx_t len = lengths[j];
		for (idx_t i = 0; i < args_size; i++) {
			auto &curr = input_lists[i];
			idx_t sel_idx = curr.sel->get_index(j);
			idx_t curr_off = 0;
			idx_t curr_len = 0;

			// Copying values from the given lists
			if (curr.validity.RowIsValid(sel_idx)) {
				auto input_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(curr);
				curr_off = input_lists_data[sel_idx].offset;
				curr_len = input_lists_data[sel_idx].length;
				auto copy_len = len < curr_len ? len : curr_len;
				idx_t entry = offset;
				for (idx_t k = 0; k < copy_len; k++) {
					if (!FlatVector::Validity(ListVector::GetEntry(args.data[i])).RowIsValid(curr_off + k)) {
						masks[i].SetInvalid(entry + k);
					}
					selections[i].set_index(entry + k, curr_off + k);
				}
			}

			// Set NULL values for list that are shorter than the output list
			if (len > curr_len) {
				for (idx_t d = curr_len; d < len; d++) {
					masks[i].SetInvalid(d + offset);
					selections[i].set_index(d + offset, 0);
				}
			}
		}
		result_data[j].length = len;
		result_data[j].offset = offset;
		offset += len;
	}
	for (idx_t child_idx = 0; child_idx < args_size; child_idx++) {
		if (args.data[child_idx].GetType() != LogicalType::SQLNULL) {
			struct_entries[child_idx]->Slice(ListVector::GetEntry(args.data[child_idx]), selections[child_idx],
			                                 result_size);
		}
		struct_entries[child_idx]->Flatten(result_size);
		FlatVector::SetValidity((*struct_entries[child_idx]), masks[child_idx]);
	}
	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
}